

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldMessageAccessor::Swap
          (RepeatedPtrFieldMessageAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  Field *in_RCX;
  long in_RDX;
  Field *in_RSI;
  long in_RDI;
  LogMessage *in_stack_ffffffffffffff78;
  LogMessage *this_00;
  LogMessage *in_stack_ffffffffffffff88;
  LogMessage *in_stack_ffffffffffffff90;
  LogMessage local_58;
  Field *local_20;
  Field *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  if (in_RDI != in_RDX) {
    this_00 = &local_58;
    LogMessage::LogMessage
              (in_stack_ffffffffffffff90,
               (LogLevel_conflict)((ulong)in_stack_ffffffffffffff88 >> 0x20),(char *)this_00,
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    in_stack_ffffffffffffff88 = LogMessage::operator<<(this_00,(char *)in_stack_ffffffffffffff78);
    LogFinisher::operator=((LogFinisher *)this_00,in_stack_ffffffffffffff78);
    LogMessage::~LogMessage((LogMessage *)0x43020a);
  }
  RepeatedPtrFieldWrapper<google::protobuf::Message>::MutableRepeatedField(local_10);
  RepeatedPtrFieldWrapper<google::protobuf::Message>::MutableRepeatedField(local_20);
  RepeatedPtrField<google::protobuf::Message>::Swap
            ((RepeatedPtrField<google::protobuf::Message> *)in_stack_ffffffffffffff90,
             (RepeatedPtrField<google::protobuf::Message> *)in_stack_ffffffffffffff88);
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    GOOGLE_CHECK(this == other_mutator);
    MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
  }